

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::ftranU(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  double *pdVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  size_type sVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  HVector *in_RDX;
  long in_RSI;
  int iVar13;
  long in_RDI;
  double in_XMM0_Qa;
  HighsInt *h_index;
  double *u_value_1;
  HighsInt *u_index_1;
  HighsInt use_clock_1;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double pivot_multiplier;
  HighsInt pivotRow;
  HighsInt i_logic;
  HighsInt u_pivot_count;
  HighsInt rhs_count;
  double *u_value;
  HighsInt *u_index;
  HighsInt *u_end;
  HighsInt *u_start;
  double *rhs_array;
  HighsInt *rhs_index;
  double rhs_synthetic_tick;
  HighsInt use_clock;
  bool report_ftran_upper_sparse;
  bool sparse_solve;
  double current_density;
  FactorTimer factor_timer;
  HighsTimerClock *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  HighsInt HVar14;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  HVectorBase<double> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  HVector *in_stack_ffffffffffffff78;
  double dVar15;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar16;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  HFactor *in_stack_ffffffffffffff90;
  HighsInt *in_stack_ffffffffffffff98;
  HighsInt *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  HighsInt *in_stack_ffffffffffffffb0;
  HighsInt *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  double dVar17;
  HighsInt h_size;
  double *in_stack_ffffffffffffffd8;
  
  h_size = (HighsInt)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10)
  ;
  HVar14 = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (*(int *)(in_RDI + 0x198) == 1) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar14,in_stack_ffffffffffffff10);
    ftranFT((HFactor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            in_stack_ffffffffffffff78);
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    HVectorBase<double>::pack
              ((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10
                     );
  }
  else if (*(int *)(in_RDI + 0x198) == 3) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar14,in_stack_ffffffffffffff10);
    ftranMPF((HFactor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (HVector *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    HVectorBase<double>::pack
              ((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10
                     );
  }
  h_index = (HighsInt *)((double)*(int *)(in_RSI + 4) * 1.0 * *(double *)(in_RDI + 0xd8));
  bVar3 = true;
  if ((-1 < *(int *)(in_RSI + 4)) && (bVar3 = true, (double)h_index <= 0.05)) {
    bVar3 = 0.1 < in_XMM0_Qa;
  }
  HVar14 = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (bVar3) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar14,in_stack_ffffffffffffff10);
    dVar17 = 0.0;
    piVar5 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cf554);
    pdVar6 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7cf56d);
    piVar7 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cf586);
    piVar8 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cf59f);
    piVar9 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cf5b8);
    in_stack_ffffffffffffff90 =
         (HFactor *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x7cf5d1);
    in_stack_ffffffffffffff8c = 0;
    sVar10 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540));
    in_stack_ffffffffffffff88 = (int)sVar10;
    iVar16 = in_stack_ffffffffffffff88;
    while( true ) {
      HVar14 = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      iVar16 = iVar16 + -1;
      if (iVar16 < 0) break;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540),(long)iVar16);
      if (*pvVar11 != -1) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540),(long)iVar16);
        iVar4 = *pvVar11;
        dVar15 = pdVar6[iVar4];
        if (ABS(dVar15) <= 1e-14) {
          pdVar6[iVar4] = 0.0;
        }
        else {
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x558),
                               (long)iVar16);
          dVar1 = *pvVar12;
          iVar13 = in_stack_ffffffffffffff8c + 1;
          piVar5[in_stack_ffffffffffffff8c] = iVar4;
          pdVar6[iVar4] = dVar15 / dVar1;
          iVar4 = piVar7[iVar16];
          iVar2 = piVar8[iVar16];
          if (*(int *)(in_RDI + 200) <= iVar16) {
            dVar17 = (double)(iVar2 - iVar4) + dVar17;
          }
          for (; in_stack_ffffffffffffff8c = iVar13, iVar4 < iVar2; iVar4 = iVar4 + 1) {
            pdVar6[piVar9[iVar4]] =
                 -(dVar15 / dVar1) * (&in_stack_ffffffffffffff90->build_realTick)[iVar4] +
                 pdVar6[piVar9[iVar4]];
          }
        }
      }
    }
    *(int *)(in_RSI + 4) = in_stack_ffffffffffffff8c;
    *(double *)(in_RSI + 0x38) =
         dVar17 * 15.0 + (double)((in_stack_ffffffffffffff88 - *(int *)(in_RDI + 200)) * 10) +
         *(double *)(in_RSI + 0x38);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar14,in_stack_ffffffffffffff10);
  }
  else {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar14,in_stack_ffffffffffffff10);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf939);
    in_stack_ffffffffffffff10 =
         (HighsTimerClock *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x7cf94f);
    in_stack_ffffffffffffff24 = *(undefined4 *)(in_RDI + 200);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf96f);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf985);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x7cf99b);
    in_stack_ffffffffffffff40 =
         (HVectorBase<double> *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf9b1)
    ;
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf9c7);
    solveHyper(h_size,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,h_index,in_stack_ffffffffffffffd8
               ,in_RDX);
    HVar14 = (HighsInt)((ulong)in_RSI >> 0x20);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar14,in_stack_ffffffffffffff10);
  }
  if (*(int *)(in_RDI + 0x198) == 2) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar14,in_stack_ffffffffffffff10);
    ftranPF(in_stack_ffffffffffffff90,
            (HVector *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    HVectorBase<double>::pack
              ((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar14,in_stack_ffffffffffffff10);
  }
  FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    HVar14,in_stack_ffffffffffffff10);
  return;
}

Assistant:

void HFactor::ftranU(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  assert(rhs.count >= 0);
  FactorTimer factor_timer;
  factor_timer.start(FactorFtranUpper, factor_timer_clock_pointer);
  // The update part
  if (update_method == kUpdateMethodFt) {
    factor_timer.start(FactorFtranUpperFT, factor_timer_clock_pointer);
    ftranFT(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperFT, factor_timer_clock_pointer);
  } else if (update_method == kUpdateMethodMpf) {
    assert(!(update_method == kUpdateMethodMpf));
    factor_timer.start(FactorFtranUpperMPF, factor_timer_clock_pointer);
    ftranMPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperMPF, factor_timer_clock_pointer);
  }

  // The regular part
  //
  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperFtranU;
  if (sparse_solve) {
    const bool report_ftran_upper_sparse =
        false;  // current_density < kHyperCancel;
    HighsInt use_clock;
    if (current_density < 0.1)
      use_clock = FactorFtranUpperSps2;
    else if (current_density < 0.5)
      use_clock = FactorFtranUpperSps1;
    else
      use_clock = FactorFtranUpperSps0;
    factor_timer.start(use_clock, factor_timer_clock_pointer);
    // Alias to non constant
    double rhs_synthetic_tick = 0;
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor U
    const HighsInt* u_start = this->u_start.data();
    const HighsInt* u_end = this->u_last_p.data();
    const HighsInt* u_index = this->u_index.data();
    const double* u_value = this->u_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    HighsInt u_pivot_count = u_pivot_index.size();
    for (HighsInt i_logic = u_pivot_count - 1; i_logic >= 0; i_logic--) {
      // Skip void
      if (u_pivot_index[i_logic] == -1) continue;
      // Normal part
      const HighsInt pivotRow = u_pivot_index[i_logic];
      double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        pivot_multiplier /= u_pivot_value[i_logic];
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = u_start[i_logic];
        const HighsInt end = u_end[i_logic];
        if (i_logic >= num_row) {
          rhs_synthetic_tick += (end - start);
        }
        for (HighsInt k = start; k < end; k++)
          rhs_array[u_index[k]] -= pivot_multiplier * u_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    rhs.synthetic_tick +=
        rhs_synthetic_tick * 15 + (u_pivot_count - num_row) * 10;
    factor_timer.stop(use_clock, factor_timer_clock_pointer);
    if (report_ftran_upper_sparse) {
      const double final_density = 1.0 * rhs.count * inv_num_row;
      printf(
          "FactorFtranUpperSps: expected_density = %10.4g; current_density = "
          "%10.4g; final_density = %10.4g\n",
          expected_density, current_density, final_density);
    }
  } else {
    HighsInt use_clock = -1;
    if (current_density < 5e-6)
      use_clock = FactorFtranUpperHyper5;
    else if (current_density < 1e-5)
      use_clock = FactorFtranUpperHyper4;
    else if (current_density < 1e-4)
      use_clock = FactorFtranUpperHyper3;
    else if (current_density < 1e-3)
      use_clock = FactorFtranUpperHyper2;
    else if (current_density < 1e-2)
      use_clock = FactorFtranUpperHyper1;
    else
      use_clock = FactorFtranUpperHyper0;
    factor_timer.start(use_clock, factor_timer_clock_pointer);
    const HighsInt* u_index = this->u_index.data();
    const double* u_value = this->u_value.data();
    solveHyper(num_row, u_pivot_lookup.data(), u_pivot_index.data(),
               u_pivot_value.data(), u_start.data(), u_last_p.data(),
               &u_index[0], &u_value[0], &rhs);
    factor_timer.stop(use_clock, factor_timer_clock_pointer);
  }
  if (update_method == kUpdateMethodPf) {
    assert(!(update_method == kUpdateMethodPf));
    factor_timer.start(FactorFtranUpperPF, factor_timer_clock_pointer);
    ftranPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorFtranUpper, factor_timer_clock_pointer);
}